

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opusfile.c
# Opt level: O0

opus_int64 op_raw_total(OggOpusFile *_of,int _li)

{
  long local_38;
  long local_28;
  int _li_local;
  OggOpusFile *_of_local;
  
  if (((_of->ready_state < 2) || (_of->seekable == 0)) || (_of->nlinks <= _li)) {
    _of_local = (OggOpusFile *)0xffffffffffffff7d;
  }
  else if (_li < 0) {
    _of_local = (OggOpusFile *)_of->end;
  }
  else {
    if (_li + 1 < _of->nlinks) {
      local_28 = _of->links[_li + 1].offset;
    }
    else {
      local_28 = _of->end;
    }
    if (_li < 1) {
      local_38 = 0;
    }
    else {
      local_38 = _of->links[_li].offset;
    }
    _of_local = (OggOpusFile *)(local_28 - local_38);
  }
  return (opus_int64)_of_local;
}

Assistant:

opus_int64 op_raw_total(const OggOpusFile *_of,int _li){
  if(OP_UNLIKELY(_of->ready_state<OP_OPENED)
   ||OP_UNLIKELY(!_of->seekable)
   ||OP_UNLIKELY(_li>=_of->nlinks)){
    return OP_EINVAL;
  }
  if(_li<0)return _of->end;
  return (_li+1>=_of->nlinks?_of->end:_of->links[_li+1].offset)
   -(_li>0?_of->links[_li].offset:0);
}